

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *pNtk)

{
  char cVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  int iVar6;
  Abc_Ntk_t *pAVar7;
  char *pcVar8;
  Abc_Obj_t *pAVar9;
  Vec_Str_t *vPref;
  size_t sVar10;
  char *pcVar11;
  Abc_Des_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  long lVar15;
  Abc_Ntk_t *pNtkSave;
  ulong uVar16;
  int Counter;
  uint local_54;
  ulong local_50;
  Abc_Ntk_t *local_48;
  Abc_Ntk_t *local_40;
  char *local_38;
  
  local_54 = 0xffffffff;
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x20a,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *)");
  }
  pAVar7 = Abc_NtkAlloc(ABC_NTK_NETLIST,pNtk->ntkFunc,1);
  pcVar8 = Extra_UtilStrsav(pNtk->pName);
  pAVar7->pName = pcVar8;
  pcVar8 = Extra_UtilStrsav(pNtk->pSpec);
  pAVar7->pSpec = pcVar8;
  Abc_NtkCleanCopy(pNtk);
  pVVar13 = pNtk->vPis;
  if (0 < pVVar13->nSize) {
    lVar15 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar13->pArray[lVar15];
      Abc_NtkDupObj(pAVar7,pAVar3,0);
      pAVar4 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
      pcVar8 = Abc_ObjName(pAVar4);
      pAVar9 = Abc_NtkFindOrCreateNet(pAVar7,pcVar8);
      (pAVar4->field_6).pCopy = pAVar9;
      Abc_ObjAddFanin(pAVar9,(pAVar3->field_6).pCopy);
      lVar15 = lVar15 + 1;
      pVVar13 = pNtk->vPis;
    } while (lVar15 < pVVar13->nSize);
  }
  pVVar13 = pNtk->vPos;
  if (0 < pVVar13->nSize) {
    lVar15 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar13->pArray[lVar15];
      Abc_NtkDupObj(pAVar7,pAVar3,0);
      pAVar4 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      pcVar8 = Abc_ObjName(pAVar4);
      pAVar9 = Abc_NtkFindOrCreateNet(pAVar7,pcVar8);
      (pAVar4->field_6).pCopy = pAVar9;
      Abc_ObjAddFanin((pAVar3->field_6).pCopy,pAVar9);
      lVar15 = lVar15 + 1;
      pVVar13 = pNtk->vPos;
    } while (lVar15 < pVVar13->nSize);
  }
  local_40 = pAVar7;
  vPref = (Vec_Str_t *)malloc(0x10);
  vPref->nCap = 1000;
  vPref->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  vPref->pArray = pcVar8;
  pcVar8 = pNtk->pName;
  local_48 = pNtk;
  sVar10 = strlen(pcVar8);
  if (0 < (int)(uint)sVar10) {
    uVar14 = (ulong)((uint)sVar10 & 0x7fffffff);
    uVar16 = 0;
    local_50 = uVar14;
    local_38 = pcVar8;
    do {
      cVar1 = pcVar8[uVar16];
      uVar2 = vPref->nSize;
      if (uVar2 == vPref->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vPref->pArray == (char *)0x0) {
            pcVar11 = (char *)malloc(0x10);
          }
          else {
            pcVar11 = (char *)realloc(vPref->pArray,0x10);
          }
          vPref->pArray = pcVar11;
          vPref->nCap = 0x10;
          uVar14 = local_50;
        }
        else {
          sVar10 = (ulong)uVar2 * 2;
          if (vPref->pArray == (char *)0x0) {
            pcVar11 = (char *)malloc(sVar10);
          }
          else {
            pcVar11 = (char *)realloc(vPref->pArray,sVar10);
          }
          vPref->pArray = pcVar11;
          vPref->nCap = (int)sVar10;
          uVar14 = local_50;
          pcVar8 = local_38;
        }
      }
      else {
        pcVar11 = vPref->pArray;
      }
      vPref->nSize = uVar2 + 1;
      pcVar11[(int)uVar2] = cVar1;
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  pNtkSave = local_40;
  pAVar7 = local_48;
  Abc_NtkFlattenLogicHierarchy_rec(local_40,local_48,(int *)&local_54,vPref);
  printf("Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n",
         (ulong)local_54,(ulong)(uint)pNtkSave->nObjCounts[10]);
  if (vPref->pArray != (char *)0x0) {
    free(vPref->pArray);
  }
  free(vPref);
  pAVar12 = pAVar7->pDesign;
  if (pAVar12 != (Abc_Des_t *)0x0) {
    if (pAVar12->vTops->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Abc_Ntk_t *)*pAVar12->vTops->pArray != pAVar7) {
      __assert_fail("Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x231,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *)");
    }
    pAVar12 = Abc_DesDupBlackboxes(pAVar12,pNtkSave);
    pNtkSave->pDesign = pAVar12;
    pVVar13 = pNtkSave->vBoxes;
    if (0 < pVVar13->nSize) {
      lVar15 = 0;
      do {
        pvVar5 = pVVar13->pArray[lVar15];
        if ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 10) {
          *(undefined8 *)((long)pvVar5 + 0x38) =
               *(undefined8 *)(*(long *)((long)pvVar5 + 0x38) + 0x160);
          pVVar13 = pNtkSave->vBoxes;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar13->nSize);
    }
  }
  Abc_NtkOrderCisCos(pNtkSave);
  if (pAVar7->pExdc != (Abc_Ntk_t *)0x0) {
    puts("EXDC is not transformed.");
  }
  iVar6 = Abc_NtkCheck(pNtkSave);
  if (iVar6 == 0) {
    fwrite("Abc_NtkFlattenLogicHierarchy(): Network check has failed.\n",0x3a,1,_stdout);
    Abc_NtkDelete(pNtkSave);
    pNtkSave = (Abc_Ntk_t *)0x0;
  }
  return pNtkSave;
}

Assistant:

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy( Abc_Ntk_t * pNtk )
{
    extern Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave );
    Vec_Str_t * vPref;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pTerm, * pNet;
    int i, Counter = -1;

    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // duplicate PIs/POs and their nets
    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanout0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pNet->pCopy, pTerm->pCopy );
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanin0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pTerm->pCopy, pNet->pCopy );
    }

    // recursively flatten hierarchy, create internal logic, add new PI/PO names if there are black boxes
    vPref = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vPref, Abc_NtkName(pNtk) );
    Abc_NtkFlattenLogicHierarchy_rec( pNtkNew, pNtk, &Counter, vPref );
    printf( "Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n", 
        Counter, Abc_NtkBlackboxNum(pNtkNew) );
    Vec_StrFree( vPref );

    if ( pNtk->pDesign )
    {
        // pass on the design
        assert( Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk );
        pNtkNew->pDesign = Abc_DesDupBlackboxes( pNtk->pDesign, pNtkNew );
        // update the pointers
        Abc_NtkForEachBlackbox( pNtkNew, pTerm, i )
            pTerm->pData = ((Abc_Ntk_t *)pTerm->pData)->pCopy;
    }

    // we may have added property outputs
    Abc_NtkOrderCisCos( pNtkNew );

    // copy the timing information
//    Abc_ManTimeDup( pNtk, pNtkNew );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        printf( "EXDC is not transformed.\n" );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkFlattenLogicHierarchy(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}